

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          TextGenerator *generator)

{
  _Rb_tree_header *p_Var1;
  Type TVar2;
  int iVar3;
  uint uVar4;
  LogMessage *pLVar5;
  undefined4 extraout_var;
  string *this_00;
  undefined4 extraout_var_01;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar6;
  undefined4 extraout_var_02;
  long *plVar7;
  _Base_ptr p_Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar9;
  _Base_ptr p_Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _Alloc_hider _Var12;
  string scratch;
  string truncated_value;
  undefined1 local_100 [16];
  undefined1 local_f0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  size_t local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8 [2];
  string local_a8;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  LogMessage local_68;
  Message *message_00;
  undefined4 extraout_var_00;
  
  if (index != -1 && *(int *)(field + 0x4c) != 3) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x6d0);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: field->is_repeated() || (index == -1): ");
    pLVar5 = internal::LogMessage::operator<<(pLVar5,"Index must be -1 for non-repeated fields");
    internal::LogFinisher::operator=((LogFinisher *)local_100,pLVar5);
    internal::LogMessage::~LogMessage(&local_68);
  }
  p_Var1 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
  p_Var10 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var8 = &p_Var1->_M_header;
  for (; p_Var10 != (_Base_ptr)0x0;
      p_Var10 = (&p_Var10->_M_left)[*(FieldDescriptor **)(p_Var10 + 1) < field]) {
    if (*(FieldDescriptor **)(p_Var10 + 1) >= field) {
      p_Var8 = p_Var10;
    }
  }
  p_Var10 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
     (p_Var10 = p_Var8, field < *(FieldDescriptor **)(p_Var8 + 1))) {
    p_Var10 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var10 == p_Var1) {
    p_Var10 = (_Base_ptr)(this->default_field_value_printer_).ptr_;
  }
  else {
    p_Var10 = p_Var10[1]._M_parent;
  }
  TVar2 = FieldDescriptor::type(field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4)) {
  case 1:
    if (*(int *)(field + 0x4c) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x2a])(reflection,message,field,index);
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x11])(reflection,message,field);
    }
    (**(code **)(*(long *)p_Var10 + 0x18))(local_100,p_Var10,iVar3);
    TextGenerator::Print(generator,(char *)local_100._0_8_,local_100._8_8_);
    break;
  case 2:
    if (*(int *)(field + 0x4c) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x2b])(reflection,message,field,index);
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x12])(reflection,message,field);
    }
    (**(code **)(*(long *)p_Var10 + 0x28))(local_100,p_Var10,iVar3);
    TextGenerator::Print(generator,(char *)local_100._0_8_,local_100._8_8_);
    break;
  case 3:
    if (*(int *)(field + 0x4c) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x2c])(reflection,message,field,index);
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x13])(reflection,message,field);
    }
    (**(code **)(*(long *)p_Var10 + 0x20))(local_100,p_Var10,iVar3);
    TextGenerator::Print(generator,(char *)local_100._0_8_,local_100._8_8_);
    break;
  case 4:
    if (*(int *)(field + 0x4c) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x2d])(reflection,message,field,index);
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x14])(reflection,message,field);
    }
    (**(code **)(*(long *)p_Var10 + 0x30))(local_100,p_Var10,iVar3);
    TextGenerator::Print(generator,(char *)local_100._0_8_,local_100._8_8_);
    break;
  case 5:
    if (*(int *)(field + 0x4c) == 3) {
      (*reflection->_vptr_Reflection[0x2f])(reflection,message,field,index);
    }
    else {
      (*reflection->_vptr_Reflection[0x16])(reflection,message,field);
    }
    (**(code **)(*(long *)p_Var10 + 0x40))(local_100,p_Var10);
    TextGenerator::Print(generator,(char *)local_100._0_8_,local_100._8_8_);
    break;
  case 6:
    if (*(int *)(field + 0x4c) == 3) {
      (*reflection->_vptr_Reflection[0x2e])(reflection,message,field,index);
    }
    else {
      (*reflection->_vptr_Reflection[0x15])(reflection,message,field);
    }
    (**(code **)(*(long *)p_Var10 + 0x38))(local_100,p_Var10);
    TextGenerator::Print(generator,(char *)local_100._0_8_,local_100._8_8_);
    break;
  case 7:
    if (*(int *)(field + 0x4c) == 3) {
      uVar4 = (*reflection->_vptr_Reflection[0x30])(reflection,message,field,index);
    }
    else {
      uVar4 = (*reflection->_vptr_Reflection[0x17])(reflection,message,field);
    }
    (**(code **)(*(long *)p_Var10 + 0x10))(local_100,p_Var10,uVar4 & 0xff);
    TextGenerator::Print(generator,(char *)local_100._0_8_,local_100._8_8_);
    break;
  case 8:
    if (*(int *)(field + 0x4c) == 3) {
      uVar4 = (*reflection->_vptr_Reflection[0x33])(reflection,message,field,index);
    }
    else {
      uVar4 = (*reflection->_vptr_Reflection[0x1a])(reflection,message,field);
    }
    this_01 = FieldDescriptor::enum_type(field);
    pEVar6 = EnumDescriptor::FindValueByNumber(this_01,uVar4);
    if (pEVar6 == (EnumValueDescriptor *)0x0) {
      StringPrintf_abi_cxx11_(&local_a8,"%d",(ulong)uVar4);
      (**(code **)(*(long *)p_Var10 + 0x58))(local_100,p_Var10,uVar4,&local_a8);
      TextGenerator::Print(generator,(char *)local_100._0_8_,local_100._8_8_);
      if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
        operator_delete((void *)local_100._0_8_,local_f0._0_8_ + 1);
      }
      goto LAB_00334c36;
    }
    (**(code **)(*(long *)p_Var10 + 0x58))(local_100,p_Var10,uVar4,*(undefined8 *)pEVar6);
    TextGenerator::Print(generator,(char *)local_100._0_8_,local_100._8_8_);
    break;
  case 9:
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    if (*(int *)(field + 0x4c) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x35])(reflection,message,field,index,&local_a8);
      this_00 = (string *)CONCAT44(extraout_var_00,iVar3);
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x1c])(reflection,message,field,&local_a8);
      this_00 = (string *)CONCAT44(extraout_var_02,iVar3);
    }
    local_80 = 0;
    local_78 = 0;
    local_88 = &local_78;
    if ((0 < this->truncate_string_field_longer_than_) &&
       ((ulong)this->truncate_string_field_longer_than_ < *(ulong *)(this_00 + 8))) {
      std::__cxx11::string::substr((ulong)&local_c8,(ulong)this_00);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
      ppaVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppaVar9) {
        local_f0._0_8_ = *ppaVar9;
        local_f0._8_8_ = plVar7[3];
        local_100._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_100 + 0x10);
      }
      else {
        local_f0._0_8_ = *ppaVar9;
        local_100._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar7;
      }
      local_100._8_8_ = plVar7[1];
      *plVar7 = (long)ppaVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      this_00 = (string *)&local_88;
      std::__cxx11::string::operator=(this_00,(string *)local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_100 + 0x10)) {
        operator_delete((void *)local_100._0_8_,local_f0._0_8_ + 1);
      }
      if (local_c8 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8) {
        operator_delete(local_c8,(long)local_b8[0] + 1);
      }
    }
    TVar2 = FieldDescriptor::type(field);
    if (TVar2 == TYPE_STRING) {
      (**(code **)(*(long *)p_Var10 + 0x48))(local_100,p_Var10,this_00);
      TextGenerator::Print(generator,(char *)local_100._0_8_,local_100._8_8_);
      local_b8[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._0_8_;
      local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_100._0_8_;
      if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
LAB_00334c04:
        operator_delete(local_c8,(long)local_b8[0] + 1);
      }
    }
    else {
      TVar2 = FieldDescriptor::type(field);
      if (TVar2 != TYPE_BYTES) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_100,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                   ,0x6f9);
        pLVar5 = internal::LogMessage::operator<<
                           ((LogMessage *)local_100,
                            "CHECK failed: (field->type()) == (FieldDescriptor::TYPE_BYTES): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar5);
        internal::LogMessage::~LogMessage((LogMessage *)local_100);
      }
      (**(code **)(*(long *)p_Var10 + 0x50))(&local_c8,p_Var10,this_00);
      TextGenerator::Print(generator,local_c8->_M_local_buf,local_c0);
      if (local_c8 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8) goto LAB_00334c04;
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
    }
LAB_00334c36:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
      return;
    }
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                          local_a8.field_2._M_local_buf[0]);
    _Var12._M_p = local_a8._M_dataplus._M_p;
    goto LAB_003349ad;
  case 10:
    if (*(int *)(field + 0x4c) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x34])(reflection,message,field,index);
      message_00 = (Message *)CONCAT44(extraout_var,iVar3);
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x1b])(reflection,message,field,0);
      message_00 = (Message *)CONCAT44(extraout_var_01,iVar3);
    }
    Print(this,message_00,generator);
  default:
    goto switchD_00334605_default;
  }
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._0_8_;
  _Var12._M_p = (pointer)local_100._0_8_;
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
LAB_003349ad:
    operator_delete(_Var12._M_p,(long)paVar11 + 1);
  }
switchD_00334605_default:
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(
    const Message& message,
    const Reflection* reflection,
    const FieldDescriptor* field,
    int index,
    TextGenerator& generator) const {
  GOOGLE_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FieldValuePrinter* printer
      = FindWithDefault(custom_printers_, field,
                        default_field_value_printer_.get());

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                   \
    case FieldDescriptor::CPPTYPE_##CPPTYPE:                            \
      generator.Print(printer->Print##METHOD(field->is_repeated()       \
               ? reflection->GetRepeated##METHOD(message, field, index) \
               : reflection->Get##METHOD(message, field)));             \
        break

    OUTPUT_FIELD( INT32,  Int32);
    OUTPUT_FIELD( INT64,  Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD( FLOAT,  Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(  BOOL,   Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      string scratch;
      const string& value = field->is_repeated()
          ? reflection->GetRepeatedStringReference(
              message, field, index, &scratch)
          : reflection->GetStringReference(message, field, &scratch);
      const string* value_to_print = &value;
      string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          truncate_string_field_longer_than_ < value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        generator.Print(printer->PrintString(*value_to_print));
      } else {
        GOOGLE_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        generator.Print(printer->PrintBytes(*value_to_print));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value = field->is_repeated()
          ? reflection->GetRepeatedEnumValue(message, field, index)
          : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != NULL) {
        generator.Print(printer->PrintEnum(enum_value, enum_desc->name()));
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        generator.Print(printer->PrintEnum(enum_value,
                                           StringPrintf("%d", enum_value)));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
            ? reflection->GetRepeatedMessage(message, field, index)
            : reflection->GetMessage(message, field),
            generator);
      break;
  }
}